

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

double helics::randDouble(RandomDistributions dist,double param1,double param2)

{
  result_type_conflict3 rVar1;
  result_type_conflict1 rVar2;
  size_t sVar3;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__urng;
  uint in_EDI;
  long *in_FS_OFFSET;
  result_type_conflict in_XMM0_Qa;
  result_type_conflict in_XMM1_Qa;
  gamma_distribution<double> distribution_14;
  binomial_distribution<int> distribution_13;
  bernoulli_distribution distribution_12;
  poisson_distribution<int> distribution_11;
  geometric_distribution<int> distribution_10;
  student_t_distribution<double> distribution_9;
  weibull_distribution<double> distribution_8;
  fisher_f_distribution<double> distribution_7;
  extreme_value_distribution<double> distribution_6;
  exponential_distribution<double> distribution_5;
  chi_squared_distribution<double> distribution_4;
  cauchy_distribution<double> distribution_3;
  lognormal_distribution<double> distribution_2;
  normal_distribution<double> distribution_1;
  uniform_real_distribution<double> distribution;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe8e8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe8f0;
  fisher_f_distribution<double> *in_stack_ffffffffffffe900;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe908;
  undefined4 in_stack_ffffffffffffe910;
  result_type_conflict2 in_stack_ffffffffffffe914;
  random_device *in_stack_ffffffffffffe930;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  result_type_conflict local_20;
  result_type_conflict local_18;
  uint local_c;
  result_type_conflict local_8;
  
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  local_c = in_EDI;
  if (*(char *)(*in_FS_OFFSET + -0x13e0) == '\0') {
    in_stack_ffffffffffffe908 = &local_13a8;
    std::random_device::random_device(in_stack_ffffffffffffe930);
    in_stack_ffffffffffffe914 = std::random_device::operator()((random_device *)0x3c04e6);
    std::this_thread::get_id();
    sVar3 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffe8f0,
                       (id *)in_stack_ffffffffffffe8e8);
    in_stack_ffffffffffffe900 =
         (fisher_f_distribution<double> *)(ulong)(in_stack_ffffffffffffe914 + (int)sVar3);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(in_stack_ffffffffffffe8f0,(result_type)in_stack_ffffffffffffe8e8);
    std::random_device::~random_device((random_device *)0x3c0548);
    *(undefined1 *)(*in_FS_OFFSET + -0x13e0) = 1;
  }
  __urng = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)(ulong)local_c;
  switch(__urng) {
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x0:
  default:
    local_8 = local_18;
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x1:
    std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8,1.94348824468246e-317);
    local_8 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x2:
    std::bernoulli_distribution::bernoulli_distribution
              ((bernoulli_distribution *)in_stack_ffffffffffffe8f0,(double)in_stack_ffffffffffffe8e8
              );
    rVar1 = std::bernoulli_distribution::operator()
                      ((bernoulli_distribution *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8
                      );
    local_8 = local_20;
    if (!rVar1) {
      local_8 = 0.0;
    }
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x3:
    std::binomial_distribution<int>::binomial_distribution
              ((binomial_distribution<int> *)in_stack_ffffffffffffe900,0,
               (double)in_stack_ffffffffffffe8f0);
    rVar2 = std::binomial_distribution<int>::operator()
                      ((binomial_distribution<int> *)in_stack_ffffffffffffe8f0,
                       in_stack_ffffffffffffe8e8);
    local_8 = (result_type_conflict)rVar2;
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x4:
    std::geometric_distribution<int>::geometric_distribution
              ((geometric_distribution<int> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8);
    rVar2 = std::geometric_distribution<int>::operator()
                      ((geometric_distribution<int> *)in_stack_ffffffffffffe8f0,
                       in_stack_ffffffffffffe8e8);
    local_8 = (double)rVar2 * local_20;
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x5:
    std::poisson_distribution<int>::poisson_distribution
              ((poisson_distribution<int> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8);
    rVar2 = std::poisson_distribution<int>::operator()
                      ((poisson_distribution<int> *)in_stack_ffffffffffffe8f0,
                       in_stack_ffffffffffffe8e8);
    local_8 = (double)rVar2 * local_20;
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x6:
    std::exponential_distribution<double>::exponential_distribution
              ((exponential_distribution<double> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8);
    local_8 = std::exponential_distribution<double>::operator()
                        ((exponential_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x7:
    std::gamma_distribution<double>::gamma_distribution
              ((gamma_distribution<double> *)in_stack_ffffffffffffe900,(double)__urng,
               (double)in_stack_ffffffffffffe8f0);
    local_8 = std::gamma_distribution<double>::operator()
                        ((gamma_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x8:
    std::weibull_distribution<double>::weibull_distribution
              ((weibull_distribution<double> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8,1.94378369593867e-317);
    local_8 = std::weibull_distribution<double>::operator()
                        ((weibull_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0x9:
    std::extreme_value_distribution<double>::extreme_value_distribution
              ((extreme_value_distribution<double> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8,1.94370760982921e-317);
    local_8 = std::extreme_value_distribution<double>::operator()
                        ((extreme_value_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0xa:
    std::normal_distribution<double>::normal_distribution
              ((normal_distribution<double> *)in_stack_ffffffffffffe900,(result_type_conflict)__urng
               ,(result_type_conflict)in_stack_ffffffffffffe8f0);
    local_8 = std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0xb:
    std::lognormal_distribution<double>::lognormal_distribution
              ((lognormal_distribution<double> *)in_stack_ffffffffffffe900,(double)__urng,
               (double)in_stack_ffffffffffffe8f0);
    local_8 = std::lognormal_distribution<double>::operator()
                        ((lognormal_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0xc:
    std::chi_squared_distribution<double>::chi_squared_distribution
              ((chi_squared_distribution<double> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8);
    local_8 = std::chi_squared_distribution<double>::operator()
                        ((chi_squared_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0xd:
    std::cauchy_distribution<double>::cauchy_distribution
              ((cauchy_distribution<double> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8,1.94360237384665e-317);
    local_8 = std::cauchy_distribution<double>::operator()
                        ((cauchy_distribution<double> *)in_stack_ffffffffffffe8f0,
                         in_stack_ffffffffffffe8e8);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0xe:
    std::fisher_f_distribution<double>::fisher_f_distribution
              (in_stack_ffffffffffffe900,(double)__urng,(double)in_stack_ffffffffffffe8f0);
    local_8 = std::fisher_f_distribution<double>::operator()
                        ((fisher_f_distribution<double> *)
                         CONCAT44(in_stack_ffffffffffffe914,in_stack_ffffffffffffe910),
                         in_stack_ffffffffffffe908);
    break;
  case (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)0xf:
    std::student_t_distribution<double>::student_t_distribution
              ((student_t_distribution<double> *)in_stack_ffffffffffffe8f0,
               (double)in_stack_ffffffffffffe8e8);
    local_8 = std::student_t_distribution<double>::operator()
                        ((student_t_distribution<double> *)in_stack_ffffffffffffe900,__urng);
  }
  return local_8;
}

Assistant:

double randDouble(RandomDistributions dist, double param1, double param2)
{
    static thread_local std::mt19937 generator(
        std::random_device{}() +
        static_cast<unsigned int>(std::hash<std::thread::id>{}(std::this_thread::get_id())));

    switch (dist) {
        case RandomDistributions::CONSTANT:
        default:
            return param1;
        case RandomDistributions::UNIFORM: {
            std::uniform_real_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::NORMAL: {
            std::normal_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::LOGNORMAL: {
            std::lognormal_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::CAUCHY: {
            std::cauchy_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::CHI_SQUARED: {
            std::chi_squared_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::EXPONENTIAL: {
            std::exponential_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::EXTREME_VALUE: {
            std::extreme_value_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::FISHER_F: {
            std::fisher_f_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::WEIBULL: {
            std::weibull_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::STUDENT_T: {
            std::student_t_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::GEOMETRIC: {  // integer multiples of some period
            std::geometric_distribution<int> distribution(param1);
            return distribution(generator) * param2;
        }
        case RandomDistributions::POISSON: {  // integer multiples of some period
            std::poisson_distribution<int> distribution(param1);
            return distribution(generator) * param2;
        }
        case RandomDistributions::BERNOULLI: {
            std::bernoulli_distribution distribution(param1);
            return distribution(generator) ? param2 : 0.0;
        }
        case RandomDistributions::BINOMIAL: {
            std::binomial_distribution<int> distribution(static_cast<int>(param1), param2);
            return static_cast<double>(distribution(generator));
        }
        case RandomDistributions::GAMMA: {
            std::gamma_distribution<double> distribution(param1, param2);
            return distribution(generator);
        } break;
    }

    // return 0.0;
}